

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_uint.h
# Opt level: O0

void vec_uint_push_back(vec_uint_t *p,uint value)

{
  uint value_local;
  vec_uint_t *p_local;
  
  if (p->size == p->cap) {
    if (p->cap < 0x10) {
      vec_uint_reserve(p,0x10);
    }
    else {
      vec_uint_reserve(p,p->cap << 1);
    }
  }
  p->data[p->size] = value;
  p->size = p->size + 1;
  return;
}

Assistant:

static inline void vec_uint_push_back(vec_uint_t *p, unsigned value)
{
    if (p->size == p->cap) {
        if (p->cap < 16)
            vec_uint_reserve(p, 16);
        else
            vec_uint_reserve(p, 2 * p->cap);
    }
    p->data[p->size] = value;
    p->size++;
}